

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_long>
          (options_serializer_boost_po *this,typed_option<unsigned_long> *typed_option)

{
  ostream *poVar1;
  unsigned_long uVar2;
  typed_option<unsigned_long> *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x18)," --");
  poVar1 = std::operator<<(poVar1,(string *)&(in_RSI->super_base_option).m_name);
  poVar1 = std::operator<<(poVar1," ");
  uVar2 = typed_option<unsigned_long>::value(in_RSI);
  std::ostream::operator<<(poVar1,uVar2);
  return;
}

Assistant:

void serialize(typed_option<T> typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }